

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O3

void __thiscall wabt::GlobalImport::~GlobalImport(GlobalImport *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Expr *pEVar2;
  pointer pcVar3;
  _func_int ***ppp_Var4;
  
  (this->super_ImportMixin<(wabt::ExternalKind)3>).super_Import._vptr_Import =
       (_func_int **)&PTR__GlobalImport_0019cd28;
  pEVar2 = (this->global).init_expr.first_;
  while (pEVar2 != (Expr *)0x0) {
    ppp_Var4 = &pEVar2->_vptr_Expr;
    pEVar2 = (pEVar2->super_intrusive_list_base<wabt::Expr>).next_;
    (*(*ppp_Var4)[1])();
  }
  (this->global).init_expr.first_ = (Expr *)0x0;
  (this->global).init_expr.last_ = (Expr *)0x0;
  (this->global).init_expr.size_ = 0;
  pcVar3 = (this->global).name._M_dataplus._M_p;
  paVar1 = &(this->global).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  Import::~Import((Import *)this);
  operator_delete(this,0x98);
  return;
}

Assistant:

explicit GlobalImport(std::string_view name = std::string_view())
      : ImportMixin<ExternalKind::Global>(), global(name) {}